

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuStringAppendFormat(CuString *str,char *format,...)

{
  char local_2038 [8];
  char buf [8192];
  va_list argp;
  char *format_local;
  CuString *str_local;
  
  buf[0x1ffc] = '0';
  buf[0x1ffd] = '\0';
  buf[0x1ffe] = '\0';
  buf[0x1fff] = '\0';
  buf[0x1ff8] = '\x10';
  buf[0x1ff9] = '\0';
  buf[0x1ffa] = '\0';
  buf[0x1ffb] = '\0';
  vsprintf(local_2038,format,buf + 0x1ff8);
  CuStringAppend(str,local_2038);
  return;
}

Assistant:

void CuStringAppendFormat(CuString* str, const char* format, ...)
{
	va_list argp;
	char buf[HUGE_STRING_LEN];
	va_start(argp, format);
	vsprintf(buf, format, argp);
	va_end(argp);
	CuStringAppend(str, buf);
}